

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

future_result<rest_rpc::req_result> * __thiscall
rest_rpc::rpc_client::async_call<(rest_rpc::CallModel)0,person>
          (future_result<rest_rpc::req_result> *__return_storage_ptr__,rpc_client *this,
          string *rpc_name,person *args)

{
  uint64_t uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<std::promise<rest_rpc::req_result>_> p;
  future<rest_rpc::req_result> future;
  buffer_type ret;
  msgpack_codec codec;
  uint64_t local_90;
  __state_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __basic_future<rest_rpc::req_result> local_78;
  buffer_type local_60;
  unique_lock<std::mutex> local_48;
  __uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> local_30;
  
  std::make_shared<std::promise<rest_rpc::req_result>>();
  std::__basic_future<rest_rpc::req_result>::__basic_future(&local_78,local_88);
  std::unique_lock<std::mutex>::unique_lock(&local_48,&this->cb_mtx_);
  local_90 = this->fu_id_ + 1;
  this->fu_id_ = local_90;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long&,std::shared_ptr<std::promise<rest_rpc::req_result>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->future_map_,&local_90,&local_88);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  local_48._M_device._0_4_ = 0;
  local_30._M_t.super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
  .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (tuple<msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>)
       (_Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>)0x0;
  rpc_service::msgpack_codec::pack_args<person>(&local_60,args);
  uVar1 = local_90;
  MD5::MD5Hash32((rpc_name->_M_dataplus)._M_p);
  write(this,(int)uVar1,(void *)0x0,(size_t)&local_60);
  _Var2._M_pi = local_78._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  __return_storage_ptr__->id = local_90;
  local_78._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->future).super___basic_future<rest_rpc::req_result>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_78._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->future).super___basic_future<rest_rpc::req_result>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  local_78._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  free(local_60.m_data);
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
            ((unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  return __return_storage_ptr__;
}

Assistant:

future_result<req_result> async_call(const std::string &rpc_name,
                                       Args &&...args) {
    auto p = std::make_shared<std::promise<req_result>>();
    std::future<req_result> future = p->get_future();

    uint64_t fu_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      fu_id_++;
      fu_id = fu_id_;
      future_map_.emplace(fu_id, std::move(p));
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(fu_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
    return future_result<req_result>{fu_id, std::move(future)};
  }